

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O0

config_item * servers_init_cb(uint count)

{
  config_item *pcVar1;
  config_item *pcVar2;
  config_item *v;
  uint i;
  config_item *items;
  void *tmp;
  uint count_local;
  
  if (g_svr_cfg != (server_info *)0x0) {
    free(g_svr_cfg);
    g_svr_cfg = (server_info *)0x0;
    g_svr_count = 0;
  }
  g_svr_cfg = (server_info *)calloc((ulong)count,0xe8);
  g_svr_count = count;
  pcVar1 = (config_item *)calloc((ulong)count,0xc0);
  if (pcVar1 != (config_item *)0x0) {
    items = pcVar1;
    for (v._4_4_ = 0; v._4_4_ < count; v._4_4_ = v._4_4_ + 1) {
      memcpy(items,svritems,0xc0);
      pcVar2 = cfg_find_item("ip_port",items);
      if (pcVar2 != (config_item *)0x0) {
        pcVar2->value = g_svr_cfg + v._4_4_;
      }
      pcVar2 = cfg_find_item("force_edns",items);
      if (pcVar2 != (config_item *)0x0) {
        pcVar2->value = &g_svr_cfg[v._4_4_].force_edns;
      }
      pcVar2 = cfg_find_item("hijack_threshold",items);
      if (pcVar2 != (config_item *)0x0) {
        pcVar2->value = &g_svr_cfg[v._4_4_].hijack_threshold;
      }
      items = items + 3;
    }
  }
  return pcVar1;
}

Assistant:

config_item * servers_init_cb(unsigned int count)
{
    void * tmp;
    config_item * items;
    unsigned int i;

    if (g_svr_cfg) {
        free(g_svr_cfg);
        g_svr_cfg = NULL;
        g_svr_count = 0;
    }
    g_svr_cfg = calloc(count, sizeof(* g_svr_cfg));
    g_svr_count = count;

    tmp = calloc(count, sizeof(svritems));
    items = (config_item *)tmp;
    if (tmp){
        for (i = 0; i < count; i++) {
            memcpy(tmp, &svritems[0], sizeof(svritems));
            // Do additional initialization for each item
            config_item * v = cfg_find_item("ip_port", tmp);
            if (v)
                v->value = &g_svr_cfg[i].ip_port;
            v = cfg_find_item("force_edns", tmp);
            if (v) {
                v->value = &g_svr_cfg[i].force_edns;
            }
            v = cfg_find_item("hijack_threshold", tmp);
            if (v) {
                v->value = &g_svr_cfg[i].hijack_threshold;
            }
            tmp += sizeof(svritems);
        }
    }
    return items;
}